

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O3

void mainchan_special_cmd(mainchan *mc,SessionSpecialCode code,int arg)

{
  PacketProtocolLayer *pPVar1;
  LogContext *ctx;
  char *pcVar2;
  
  if (SS_SIGUSR2 < code) {
    return;
  }
  pPVar1 = mc->ppl;
  switch(code) {
  case SS_BRK:
    (*mc->sc->vt->send_serial_break)(mc->sc,false,0);
    return;
  case SS_EOF:
    if (mc->ready == false) {
      mc->eof_pending = true;
    }
    else if (mc->eof_sent == false) {
      (*mc->sc->vt->write_eof)(mc->sc);
      mc->eof_sent = true;
    }
  default:
    return;
  case SS_SIGINT:
    pcVar2 = "INT";
    break;
  case SS_SIGTERM:
    pcVar2 = "TERM";
    break;
  case SS_SIGKILL:
    pcVar2 = "KILL";
    break;
  case SS_SIGQUIT:
    pcVar2 = "QUIT";
    break;
  case SS_SIGHUP:
    pcVar2 = "HUP";
    break;
  case SS_SIGABRT:
    pcVar2 = "ABRT";
    break;
  case SS_SIGALRM:
    pcVar2 = "ALRM";
    break;
  case SS_SIGFPE:
    pcVar2 = "FPE";
    break;
  case SS_SIGILL:
    pcVar2 = "ILL";
    break;
  case SS_SIGPIPE:
    pcVar2 = "PIPE";
    break;
  case SS_SIGSEGV:
    pcVar2 = "SEGV";
    break;
  case SS_SIGUSR1:
    pcVar2 = "USR1";
    break;
  case SS_SIGUSR2:
    pcVar2 = "USR2";
  }
  (*mc->sc->vt->send_signal)(mc->sc,false,pcVar2);
  ctx = pPVar1->logctx;
  pcVar2 = dupprintf("Sent signal SIG%s",pcVar2);
  logevent_and_free(ctx,pcVar2);
  return;
}

Assistant:

void mainchan_special_cmd(mainchan *mc, SessionSpecialCode code, int arg)
{
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */
    const char *signame;

    if (code == SS_EOF) {
        if (!mc->ready) {
            /*
             * Buffer the EOF to send as soon as the main channel is
             * fully set up.
             */
            mc->eof_pending = true;
        } else if (!mc->eof_sent) {
            sshfwd_write_eof(mc->sc);
            mc->eof_sent = true;
        }
    } else if (code == SS_BRK) {
        sshfwd_send_serial_break(
            mc->sc, false, 0 /* default break length */);
    } else if ((signame = ssh_signal_lookup(code)) != NULL) {
        /* It's a signal. */
        sshfwd_send_signal(mc->sc, false, signame);
        ppl_logevent("Sent signal SIG%s", signame);
    }
}